

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O1

string_t __thiscall
duckdb::TrimOperator<true,false>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<true,false> *this,string_t input,Vector *result)

{
  utf8proc_category_t uVar1;
  utf8proc_ssize_t uVar2;
  ulong uVar3;
  StringVector *len;
  StringVector *extraout_RDX;
  long lVar4;
  ulong uVar5;
  undefined1 *__dest;
  utf8proc_int32_t codepoint;
  string_t target;
  utf8proc_int32_t local_5c;
  undefined1 local_58 [16];
  StringVector *local_48;
  undefined8 local_40;
  long local_38;
  
  len = input.value._8_8_;
  local_38 = input.value._0_8_;
  uVar3 = (ulong)this & 0xffffffff;
  lVar4 = local_38;
  if (uVar3 < 0xd) {
    lVar4 = (long)&local_40 + 4;
  }
  uVar5 = 0;
  local_48 = len;
  local_40 = this;
  do {
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) break;
    uVar2 = utf8proc_iterate((utf8proc_uint8_t *)(lVar4 + uVar5),uVar3 - uVar5,&local_5c);
    uVar1 = utf8proc_category(local_5c);
    if (uVar1 != UTF8PROC_CATEGORY_ZS) {
      uVar2 = 0;
    }
    uVar5 = uVar5 + uVar2;
    len = extraout_RDX;
  } while (uVar1 == UTF8PROC_CATEGORY_ZS);
  local_58 = (undefined1  [16])
             StringVector::EmptyString(local_48,(Vector *)(uVar3 - uVar5),(idx_t)len);
  __dest = local_58._8_8_;
  if (local_58._0_4_ < 0xd) {
    __dest = local_58 + 4;
  }
  switchD_00b1422a::default(__dest,(void *)(lVar4 + uVar5),(size_t)(uVar3 - uVar5));
  uVar3 = (ulong)(uint)local_58._0_4_;
  if (uVar3 < 0xd) {
    switchD_005700f1::default(local_58 + 4 + uVar3,0,0xc - uVar3);
  }
  else {
    local_58._4_4_ = *(undefined4 *)local_58._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}